

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<unsigned_char,_128UL>::resize
          (small_vector<unsigned_char,_128UL> *this,size_t new_elements)

{
  uchar *__first;
  bool bVar1;
  bool bVar2;
  uchar *__result;
  size_type local_48;
  uchar *new_buffer;
  uchar *old_buffer;
  bool is_small_after;
  bool is_small_before;
  size_t new_elements_local;
  small_vector<unsigned_char,_128UL> *this_local;
  
  if (new_elements != this->elements_) {
    bVar1 = is_small(this->elements_);
    bVar2 = is_small(new_elements);
    local_48 = new_elements;
    if (bVar2) {
      local_48 = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->big_buffer_,local_48);
    __first = this->buffer_;
    __result = set_buffer_ptr(this,new_elements);
    if (bVar1 != bVar2) {
      std::copy<unsigned_char*,unsigned_char*>(__first,__first + this->elements_,__result);
    }
    this->elements_ = new_elements;
  }
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::resize (std::size_t new_elements) {
        if (new_elements != elements_) {
            bool const is_small_before = is_small (elements_);
            bool const is_small_after = is_small (new_elements);

            big_buffer_.resize (is_small_after ? 0 : new_elements);

            // Update the buffer pointer and preserve the contents if we've switched from small to
            // larger buffer or vice-versa.
            auto * const old_buffer = buffer_;
            auto * const new_buffer = this->set_buffer_ptr (new_elements);

            if (is_small_before != is_small_after) {
                std::copy (old_buffer, old_buffer + elements_, new_buffer);
            }

            elements_ = new_elements;
        }
    }